

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

bool __thiscall JFSON::Json::operator<(Json *this,Json *other)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  peVar1 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (other->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr) {
    bVar2 = false;
  }
  else {
    iVar3 = (**peVar1->_vptr_JsonValue)();
    iVar4 = (**((other->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_JsonValue)();
    peVar1 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (iVar3 == iVar4) {
      iVar3 = (*peVar1->_vptr_JsonValue[2])
                        (peVar1,(other->m_ptr).
                                super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      return SUB41(iVar3,0);
    }
    iVar3 = (**peVar1->_vptr_JsonValue)();
    iVar4 = (**((other->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_JsonValue)();
    bVar2 = iVar3 < iVar4;
  }
  return bVar2;
}

Assistant:

bool Json::operator< (const Json &other) const {
    if (m_ptr == other.m_ptr)
        return false;
    if (m_ptr->type() != other.m_ptr->type())
        return m_ptr->type() < other.m_ptr->type();

    return m_ptr->less(other.m_ptr.get());
}